

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O3

int luv_udp_try_send(lua_State *L)

{
  int iVar1;
  uint status;
  uv_udp_t *handle;
  char *ip;
  ulong uVar2;
  int in_ESI;
  sockaddr_storage addr;
  uv_buf_t local_b8;
  sockaddr_in6 local_a8 [4];
  
  handle = luv_check_udp(L,in_ESI);
  local_b8.base = luaL_checklstring(L,2,&local_b8.len);
  ip = luaL_checklstring(L,3,(size_t *)0x0);
  uVar2 = luaL_checkinteger(L,4);
  iVar1 = uv_ip4_addr(ip,(int)uVar2,(sockaddr_in *)local_a8);
  if ((iVar1 != 0) && (iVar1 = uv_ip6_addr(ip,(int)uVar2,local_a8), iVar1 != 0)) {
    iVar1 = luaL_error(L,"Invalid IP address or port [%s:%d]",ip,uVar2 & 0xffffffff);
    return iVar1;
  }
  iVar1 = 1;
  status = uv_udp_try_send(handle,&local_b8,1,(sockaddr *)local_a8);
  if ((int)status < 0) {
    luv_error(L,status);
    iVar1 = 3;
  }
  else {
    lua_pushinteger(L,(ulong)status);
  }
  return iVar1;
}

Assistant:

static int luv_udp_try_send(lua_State* L) {
  uv_udp_t* handle = luv_check_udp(L, 1);
  int err_or_num_bytes;
  struct sockaddr_storage addr;
  struct sockaddr* addr_ptr;
  size_t count;
  uv_buf_t* bufs = luv_check_bufs_noref(L, 2, &count);
  addr_ptr = luv_check_addr(L, &addr, 3, 4);
  err_or_num_bytes = uv_udp_try_send(handle, bufs, count, addr_ptr);
  free(bufs);
  if (err_or_num_bytes < 0) return luv_error(L, err_or_num_bytes);
  lua_pushinteger(L, err_or_num_bytes);
  return 1;
}